

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathNodeSetDel(xmlNodeSetPtr cur,xmlNodePtr val)

{
  int iVar1;
  xmlNodePtr ns;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  if (val != (xmlNodePtr)0x0 && cur != (xmlNodeSetPtr)0x0) {
    uVar3 = (ulong)cur->nodeNr;
    bVar7 = 0 < (long)uVar3;
    if (0 < (long)uVar3) {
      if (*cur->nodeTab == val) {
        uVar6 = 0;
      }
      else {
        uVar5 = 0;
        do {
          if (uVar3 - 1 == uVar5) {
            return;
          }
          uVar6 = uVar5 + 1;
          lVar2 = uVar5 + 1;
          uVar5 = uVar6;
        } while (cur->nodeTab[lVar2] != val);
        bVar7 = uVar6 < uVar3;
      }
      if (bVar7) {
        ns = cur->nodeTab[uVar6 & 0xffffffff];
        if ((ns != (xmlNodePtr)0x0) && (ns->type == XML_NAMESPACE_DECL)) {
          xmlXPathNodeSetFreeNs((xmlNsPtr)ns);
        }
        iVar1 = cur->nodeNr;
        uVar4 = iVar1 - 1;
        cur->nodeNr = uVar4;
        if ((int)uVar6 < (int)uVar4) {
          do {
            cur->nodeTab[uVar6] = cur->nodeTab[uVar6 + 1];
            uVar6 = uVar6 + 1;
          } while (uVar4 != uVar6);
        }
        cur->nodeTab[(long)iVar1 + -1] = (xmlNodePtr)0x0;
      }
    }
  }
  return;
}

Assistant:

void
xmlXPathNodeSetDel(xmlNodeSetPtr cur, xmlNodePtr val) {
    int i;

    if (cur == NULL) return;
    if (val == NULL) return;

    /*
     * find node in nodeTab
     */
    for (i = 0;i < cur->nodeNr;i++)
        if (cur->nodeTab[i] == val) break;

    if (i >= cur->nodeNr) {	/* not found */
#ifdef DEBUG
        xmlGenericError(xmlGenericErrorContext,
	        "xmlXPathNodeSetDel: Node %s wasn't found in NodeList\n",
		val->name);
#endif
        return;
    }
    if ((cur->nodeTab[i] != NULL) &&
	(cur->nodeTab[i]->type == XML_NAMESPACE_DECL))
	xmlXPathNodeSetFreeNs((xmlNsPtr) cur->nodeTab[i]);
    cur->nodeNr--;
    for (;i < cur->nodeNr;i++)
        cur->nodeTab[i] = cur->nodeTab[i + 1];
    cur->nodeTab[cur->nodeNr] = NULL;
}